

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcRobustBufferAccessBehaviorTests.cpp
# Opt level: O2

void deqp::RobustBufferAccessBehavior::Shader::Create(Functions *gl,GLenum stage,GLuint *out_id)

{
  GLuint GVar1;
  GLenum err;
  TestError *this;
  
  GVar1 = (*gl->createShader)(stage);
  err = (*gl->getError)();
  glu::checkError(err,"CreateShader",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcRobustBufferAccessBehaviorTests.cpp"
                  ,0x248);
  if (GVar1 != 0) {
    *out_id = GVar1;
    return;
  }
  this = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this,"Failed to create shader",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcRobustBufferAccessBehaviorTests.cpp"
             ,0x24c);
  __cxa_throw(this,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void Shader::Create(const glw::Functions& gl, glw::GLenum stage, glw::GLuint& out_id)
{
	const GLuint id = gl.createShader(stage);
	GLU_EXPECT_NO_ERROR(gl.getError(), "CreateShader");

	if (m_invalid_id == id)
	{
		TCU_FAIL("Failed to create shader");
	}

	out_id = id;
}